

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_akey.cc
# Opt level: O3

void * v2i_AUTHORITY_KEYID(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *values)

{
  char *__s1;
  X509 *x;
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  size_t sVar4;
  X509_EXTENSION *ext;
  ASN1_OCTET_STRING *a;
  AUTHORITY_KEYID *pAVar5;
  ASN1_INTEGER *x_00;
  ASN1_INTEGER *a_00;
  GENERAL_NAME *p;
  int line;
  X509_NAME *pXVar6;
  char cVar7;
  OPENSSL_STACK *sk;
  char cVar8;
  
  sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)values);
  if (sVar2 == 0) {
    cVar7 = '\0';
    cVar8 = '\0';
  }
  else {
    cVar8 = '\0';
    sVar2 = 0;
    cVar7 = '\0';
    do {
      pvVar3 = OPENSSL_sk_value((OPENSSL_STACK *)values,sVar2);
      __s1 = *(char **)((long)pvVar3 + 8);
      iVar1 = strcmp(__s1,"keyid");
      if (iVar1 == 0) {
        if (*(char **)((long)pvVar3 + 0x10) == (char *)0x0) {
          cVar8 = '\x01';
        }
        else {
          iVar1 = strcmp(*(char **)((long)pvVar3 + 0x10),"always");
          cVar8 = (iVar1 == 0) + '\x01';
        }
      }
      else {
        iVar1 = strcmp(__s1,"issuer");
        if (iVar1 != 0) {
          ERR_put_error(0x14,0,0x9f,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_akey.cc"
                        ,0x78);
          ERR_add_error_data(2,"name=",*(undefined8 *)((long)pvVar3 + 8));
          return (void *)0x0;
        }
        if (*(char **)((long)pvVar3 + 0x10) == (char *)0x0) {
          cVar7 = '\x01';
        }
        else {
          iVar1 = strcmp(*(char **)((long)pvVar3 + 0x10),"always");
          cVar7 = (iVar1 == 0) + '\x01';
        }
      }
      sVar2 = sVar2 + 1;
      sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)values);
    } while (sVar2 < sVar4);
  }
  if (ctx != (X509V3_CTX *)0x0) {
    x = (X509 *)ctx->issuer_cert;
    if (x != (X509 *)0x0) {
      if (cVar8 == '\0') {
        a = (ASN1_OCTET_STRING *)0x0;
      }
      else {
        iVar1 = X509_get_ext_by_NID(x,0x52,-1);
        if ((iVar1 < 0) || (ext = X509_get_ext(x,iVar1), ext == (X509_EXTENSION *)0x0)) {
          a = (ASN1_OCTET_STRING *)0x0;
        }
        else {
          a = (ASN1_OCTET_STRING *)X509V3_EXT_d2i(ext);
        }
        if ((cVar8 == '\x02') && (a == (ASN1_OCTET_STRING *)0x0)) {
          iVar1 = 0x9b;
          line = 0x8f;
          goto LAB_002281e5;
        }
      }
      if ((cVar7 == '\x02') || (cVar7 != '\0' && a == (ASN1_OCTET_STRING *)0x0)) {
        pXVar6 = X509_get_issuer_name(x);
        pXVar6 = X509_NAME_dup(pXVar6);
        x_00 = X509_get0_serialNumber((X509 *)x);
        a_00 = ASN1_INTEGER_dup((ASN1_INTEGER *)x_00);
        if (pXVar6 == (X509_NAME *)0x0 || a_00 == (ASN1_INTEGER *)0x0) {
          ERR_put_error(0x14,0,0x9a,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_akey.cc"
                        ,0x98);
        }
        else {
          pAVar5 = AUTHORITY_KEYID_new();
          if ((((pAVar5 != (AUTHORITY_KEYID *)0x0) &&
               (sk = OPENSSL_sk_new_null(), sk != (OPENSSL_STACK *)0x0)) &&
              (p = GENERAL_NAME_new(), p != (GENERAL_NAME *)0x0)) &&
             (sVar2 = OPENSSL_sk_push(sk,p), sVar2 != 0)) {
            p->type = 4;
            (p->d).directoryName = pXVar6;
            goto LAB_00228252;
          }
        }
      }
      else {
        pAVar5 = AUTHORITY_KEYID_new();
        a_00 = (ASN1_INTEGER *)0x0;
        sk = (OPENSSL_STACK *)0x0;
        pXVar6 = (X509_NAME *)0x0;
        if (pAVar5 != (AUTHORITY_KEYID *)0x0) {
LAB_00228252:
          pAVar5->issuer = (GENERAL_NAMES *)sk;
          pAVar5->serial = a_00;
          pAVar5->keyid = a;
          return pAVar5;
        }
      }
      X509_NAME_free(pXVar6);
      ASN1_INTEGER_free(a_00);
      ASN1_OCTET_STRING_free(a);
      return (void *)0x0;
    }
    if (ctx->flags == 1) {
      pAVar5 = AUTHORITY_KEYID_new();
      return pAVar5;
    }
  }
  iVar1 = 0x8c;
  line = 0x82;
LAB_002281e5:
  ERR_put_error(0x14,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_akey.cc"
                ,line);
  return (void *)0x0;
}

Assistant:

static void *v2i_AUTHORITY_KEYID(const X509V3_EXT_METHOD *method,
                                 const X509V3_CTX *ctx,
                                 const STACK_OF(CONF_VALUE) *values) {
  char keyid = 0, issuer = 0;
  int j;
  ASN1_OCTET_STRING *ikeyid = NULL;
  X509_NAME *isname = NULL;
  GENERAL_NAMES *gens = NULL;
  GENERAL_NAME *gen = NULL;
  ASN1_INTEGER *serial = NULL;
  const X509 *cert;
  AUTHORITY_KEYID *akeyid;

  for (size_t i = 0; i < sk_CONF_VALUE_num(values); i++) {
    const CONF_VALUE *cnf = sk_CONF_VALUE_value(values, i);
    if (!strcmp(cnf->name, "keyid")) {
      keyid = 1;
      if (cnf->value && !strcmp(cnf->value, "always")) {
        keyid = 2;
      }
    } else if (!strcmp(cnf->name, "issuer")) {
      issuer = 1;
      if (cnf->value && !strcmp(cnf->value, "always")) {
        issuer = 2;
      }
    } else {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_UNKNOWN_OPTION);
      ERR_add_error_data(2, "name=", cnf->name);
      return NULL;
    }
  }

  if (!ctx || !ctx->issuer_cert) {
    if (ctx && (ctx->flags == X509V3_CTX_TEST)) {
      return AUTHORITY_KEYID_new();
    }
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_NO_ISSUER_CERTIFICATE);
    return NULL;
  }

  cert = ctx->issuer_cert;

  if (keyid) {
    j = X509_get_ext_by_NID(cert, NID_subject_key_identifier, -1);
    const X509_EXTENSION *ext;
    if ((j >= 0) && (ext = X509_get_ext(cert, j))) {
      ikeyid = reinterpret_cast<ASN1_OCTET_STRING *>(X509V3_EXT_d2i(ext));
    }
    if (keyid == 2 && !ikeyid) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_UNABLE_TO_GET_ISSUER_KEYID);
      return NULL;
    }
  }

  if ((issuer && !ikeyid) || (issuer == 2)) {
    isname = X509_NAME_dup(X509_get_issuer_name(cert));
    serial = ASN1_INTEGER_dup(X509_get0_serialNumber(cert));
    if (!isname || !serial) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_UNABLE_TO_GET_ISSUER_DETAILS);
      goto err;
    }
  }

  if (!(akeyid = AUTHORITY_KEYID_new())) {
    goto err;
  }

  if (isname) {
    if (!(gens = sk_GENERAL_NAME_new_null()) || !(gen = GENERAL_NAME_new()) ||
        !sk_GENERAL_NAME_push(gens, gen)) {
      goto err;
    }
    gen->type = GEN_DIRNAME;
    gen->d.dirn = isname;
  }

  akeyid->issuer = gens;
  akeyid->serial = serial;
  akeyid->keyid = ikeyid;

  return akeyid;

err:
  X509_NAME_free(isname);
  ASN1_INTEGER_free(serial);
  ASN1_OCTET_STRING_free(ikeyid);
  return NULL;
}